

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O0

void av1_highbd_filter_intra_edge_sse4_1(uint16_t *p,int sz,int strength)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int in_EDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i in123;
  __m128i in04;
  __m128i in4;
  __m128i in3;
  __m128i in2_1;
  __m128i in1_1;
  int n_out_1;
  __m128i in8_1;
  __m128i in0_1;
  __m128i iden_1;
  __m128i coef0_1;
  __m128i mask;
  __m128i n0;
  __m128i out0;
  __m128i eight;
  __m128i d1;
  __m128i d0;
  __m128i in02;
  __m128i in2;
  __m128i in1;
  int n_out;
  __m128i in8;
  __m128i in0;
  __m128i iden;
  __m128i coef0;
  int use_3tap_filter;
  int len;
  uint16_t *out;
  uint16_t *in;
  __m128i last;
  int local_6a4;
  int local_69c;
  undefined1 (*local_698) [16];
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_608;
  short local_5bc;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_528;
  undefined8 uStack_520;
  short local_4dc;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  int local_48c;
  undefined1 (*local_488) [16];
  undefined1 (*local_480) [16];
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short sStack_31a;
  short sStack_2fa;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  __m128i mask_1;
  __m128i n0_1;
  __m128i out0_1;
  __m128i eight_1;
  __m128i d1_1;
  __m128i d0_1;
  
  if (in_EDX != 0) {
    *(undefined2 *)(in_RDI[-1] + 0xe) = *(undefined2 *)*in_RDI;
    uVar1 = *(undefined2 *)(*in_RDI + (long)(in_ESI + -1) * 2);
    auVar9._2_2_ = uVar1;
    auVar9._0_2_ = uVar1;
    auVar9._4_2_ = uVar1;
    auVar9._6_2_ = uVar1;
    auVar9._10_2_ = uVar1;
    auVar9._8_2_ = uVar1;
    auVar9._12_2_ = uVar1;
    auVar9._14_2_ = uVar1;
    *(undefined1 (*) [16])(*in_RDI + (long)in_ESI * 2) = auVar9;
    local_698 = in_RDI;
    if (in_EDX == 3) {
      local_698 = (undefined1 (*) [16])(in_RDI[-1] + 0xe);
    }
    local_480 = local_698;
    local_488 = (undefined1 (*) [16])(*in_RDI + 2);
    local_48c = in_ESI + -1;
    if (in_EDX < 3) {
      auVar9 = lddqu(auVar9,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::kern[in_EDX + -1]
                    );
      auVar10 = lddqu(auVar9,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::v_const[0]);
      local_4c8 = lddqu(auVar10,*local_698);
      local_4d8 = lddqu(local_4c8,local_698[1]);
      for (; 0 < local_48c; local_48c = local_48c - local_69c) {
        if (local_48c < 8) {
          local_69c = local_48c;
        }
        else {
          local_69c = 8;
        }
        local_298 = local_4c8._0_2_;
        sStack_296 = local_4c8._2_2_;
        sStack_294 = local_4c8._4_2_;
        sStack_292 = local_4c8._6_2_;
        sStack_290 = local_4c8._8_2_;
        sStack_28e = local_4c8._10_2_;
        sStack_28c = local_4c8._12_2_;
        sStack_28a = local_4c8._14_2_;
        sStack_29c = local_4d8._0_2_;
        sStack_29a = local_4d8._2_2_;
        local_148 = auVar9._0_2_;
        sStack_146 = auVar9._2_2_;
        sStack_144 = auVar9._4_2_;
        sStack_142 = auVar9._6_2_;
        sStack_140 = auVar9._8_2_;
        sStack_13e = auVar9._10_2_;
        sStack_13c = auVar9._12_2_;
        sStack_13a = auVar9._14_2_;
        local_528._0_4_ = CONCAT22(sStack_296 * sStack_146,(local_298 + sStack_294) * local_148);
        local_528._0_6_ = CONCAT24((sStack_296 + sStack_292) * sStack_144,(undefined4)local_528);
        local_528 = CONCAT26(sStack_294 * sStack_142,(undefined6)local_528);
        uStack_520._0_2_ = (sStack_294 + sStack_290) * sStack_140;
        uStack_520._2_2_ = sStack_292 * sStack_13e;
        uStack_520._4_2_ = (sStack_292 + sStack_28e) * sStack_13c;
        uStack_520._6_2_ = sStack_290 * sStack_13a;
        auVar3._2_2_ = sStack_28e * sStack_146;
        auVar3._0_2_ = (sStack_290 + sStack_28c) * local_148;
        auVar3._4_2_ = (sStack_28e + sStack_28a) * sStack_144;
        auVar3._6_2_ = sStack_28c * sStack_142;
        auVar3._10_2_ = sStack_28a * sStack_13e;
        auVar3._8_2_ = (sStack_28c + sStack_29c) * sStack_140;
        auVar3._12_2_ = (sStack_28a + sStack_29a) * sStack_13c;
        auVar3._14_2_ = sStack_29c * sStack_13a;
        auVar4._8_8_ = uStack_520;
        auVar4._0_8_ = local_528;
        auVar11 = phaddw(auVar4,auVar3);
        local_2b8 = auVar11._0_2_;
        sStack_2b6 = auVar11._2_2_;
        sStack_2b4 = auVar11._4_2_;
        sStack_2b2 = auVar11._6_2_;
        sStack_2b0 = auVar11._8_2_;
        sStack_2ae = auVar11._10_2_;
        sStack_2ac = auVar11._12_2_;
        sStack_2aa = auVar11._14_2_;
        auVar12._0_8_ =
             CONCAT26((ushort)(sStack_2b2 + 8U) >> 4,
                      CONCAT24((ushort)(sStack_2b4 + 8U) >> 4,
                               CONCAT22((ushort)(sStack_2b6 + 8U) >> 4,(ushort)(local_2b8 + 8U) >> 4
                                       )));
        auVar12._8_2_ = (ushort)(sStack_2b0 + 8U) >> 4;
        auVar12._10_2_ = (ushort)(sStack_2ae + 8U) >> 4;
        auVar12._12_2_ = (ushort)(sStack_2ac + 8U) >> 4;
        auVar12._14_2_ = (ushort)(sStack_2aa + 8U) >> 4;
        auVar11 = lddqu(auVar12,*local_488);
        local_4dc = (short)local_69c;
        local_c8 = auVar10._0_2_;
        sStack_c6 = auVar10._2_2_;
        sStack_c4 = auVar10._4_2_;
        sStack_c2 = auVar10._6_2_;
        sStack_c0 = auVar10._8_2_;
        sStack_be = auVar10._10_2_;
        sStack_bc = auVar10._12_2_;
        sStack_ba = auVar10._14_2_;
        uStack_520 = auVar12._8_8_;
        auVar7._2_2_ = -(ushort)(sStack_c6 < local_4dc);
        auVar7._0_2_ = -(ushort)(local_c8 < local_4dc);
        auVar7._4_2_ = -(ushort)(sStack_c4 < local_4dc);
        auVar7._6_2_ = -(ushort)(sStack_c2 < local_4dc);
        auVar7._10_2_ = -(ushort)(sStack_be < local_4dc);
        auVar7._8_2_ = -(ushort)(sStack_c0 < local_4dc);
        auVar7._12_2_ = -(ushort)(sStack_bc < local_4dc);
        auVar7._14_2_ = -(ushort)(sStack_ba < local_4dc);
        auVar8._8_8_ = uStack_520;
        auVar8._0_8_ = auVar12._0_8_;
        auVar11 = pblendvb(auVar11,auVar8,auVar7);
        local_558 = auVar11._0_8_;
        uStack_550 = auVar11._8_8_;
        *(undefined8 *)*local_488 = local_558;
        *(undefined8 *)(*local_488 + 8) = uStack_550;
        local_4c8 = local_4d8;
        local_4d8 = lddqu(local_4d8,local_480[2]);
        local_488 = local_488 + 1;
        local_480 = local_480 + 1;
      }
    }
    else {
      auVar9 = lddqu(auVar9,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::kern[in_EDX + -1]
                    );
      auVar10 = lddqu(auVar9,(undefined1  [16])av1_highbd_filter_intra_edge_sse4_1::v_const[0]);
      local_5a8 = lddqu(auVar10,*local_698);
      local_5b8 = lddqu(local_5a8,local_698[1]);
      for (; 0 < local_48c; local_48c = local_48c - local_6a4) {
        if (local_48c < 8) {
          local_6a4 = local_48c;
        }
        else {
          local_6a4 = 8;
        }
        local_2d8 = local_5a8._0_2_;
        sStack_2d6 = local_5a8._2_2_;
        sStack_2d4 = local_5a8._4_2_;
        sStack_2d2 = local_5a8._6_2_;
        sStack_2d0 = local_5a8._8_2_;
        sStack_2ce = local_5a8._10_2_;
        sStack_2cc = local_5a8._12_2_;
        sStack_2ca = local_5a8._14_2_;
        local_2e8 = (short)local_608;
        sStack_2e6 = (short)((ulong)local_608 >> 0x10);
        sStack_2e4 = (short)((ulong)local_608 >> 0x20);
        sStack_2e2 = (short)((ulong)local_608 >> 0x30);
        sStack_2ea = local_5b8._0_2_;
        sStack_2fa = local_5b8._2_2_;
        sStack_31a = local_5b8._4_2_;
        local_188 = auVar9._0_2_;
        sStack_186 = auVar9._2_2_;
        sStack_184 = auVar9._4_2_;
        sStack_182 = auVar9._6_2_;
        sStack_180 = auVar9._8_2_;
        sStack_17e = auVar9._10_2_;
        sStack_17c = auVar9._12_2_;
        sStack_17a = auVar9._14_2_;
        local_638._0_4_ =
             CONCAT22((sStack_2d6 + sStack_2d4 + local_2d8) * sStack_186,
                      (local_2d8 + local_2e8) * local_188);
        local_638._0_6_ = CONCAT24((sStack_2d6 + sStack_2e6) * sStack_184,(undefined4)local_638);
        local_638 = CONCAT26((sStack_2d4 + sStack_2d2 + sStack_2d6) * sStack_182,
                             (undefined6)local_638);
        uStack_630._0_2_ = (sStack_2d4 + sStack_2e4) * sStack_180;
        uStack_630._2_2_ = (sStack_2d2 + sStack_2d0 + sStack_2d4) * sStack_17e;
        uStack_630._4_2_ = (sStack_2d2 + sStack_2e2) * sStack_17c;
        uStack_630._6_2_ = (sStack_2d0 + sStack_2ce + sStack_2d2) * sStack_17a;
        auVar11._2_2_ = (sStack_2ce + sStack_2cc + sStack_2ca) * sStack_186;
        auVar11._0_2_ = sStack_2d0 * 2 * local_188;
        auVar11._4_2_ = sStack_2ce * 2 * sStack_184;
        auVar11._6_2_ = (sStack_2cc + sStack_2ca + sStack_2ea) * sStack_182;
        auVar11._10_2_ = (sStack_2ca + sStack_2ea + sStack_2fa) * sStack_17e;
        auVar11._8_2_ = sStack_2cc * 2 * sStack_180;
        auVar11._12_2_ = sStack_2ca * 2 * sStack_17c;
        auVar11._14_2_ = (sStack_2ea + sStack_2fa + sStack_31a) * sStack_17a;
        auVar2._8_8_ = uStack_630;
        auVar2._0_8_ = local_638;
        auVar11 = phaddw(auVar2,auVar11);
        local_338 = auVar11._0_2_;
        sStack_336 = auVar11._2_2_;
        sStack_334 = auVar11._4_2_;
        sStack_332 = auVar11._6_2_;
        sStack_330 = auVar11._8_2_;
        sStack_32e = auVar11._10_2_;
        sStack_32c = auVar11._12_2_;
        sStack_32a = auVar11._14_2_;
        auVar13._0_8_ =
             CONCAT26((ushort)(sStack_332 + 8U) >> 4,
                      CONCAT24((ushort)(sStack_334 + 8U) >> 4,
                               CONCAT22((ushort)(sStack_336 + 8U) >> 4,(ushort)(local_338 + 8U) >> 4
                                       )));
        auVar13._8_2_ = (ushort)(sStack_330 + 8U) >> 4;
        auVar13._10_2_ = (ushort)(sStack_32e + 8U) >> 4;
        auVar13._12_2_ = (ushort)(sStack_32c + 8U) >> 4;
        auVar13._14_2_ = (ushort)(sStack_32a + 8U) >> 4;
        auVar11 = lddqu(auVar13,*local_488);
        local_5bc = (short)local_6a4;
        local_e8 = auVar10._0_2_;
        sStack_e6 = auVar10._2_2_;
        sStack_e4 = auVar10._4_2_;
        sStack_e2 = auVar10._6_2_;
        sStack_e0 = auVar10._8_2_;
        sStack_de = auVar10._10_2_;
        sStack_dc = auVar10._12_2_;
        sStack_da = auVar10._14_2_;
        uStack_630 = auVar13._8_8_;
        auVar5._2_2_ = -(ushort)(sStack_e6 < local_5bc);
        auVar5._0_2_ = -(ushort)(local_e8 < local_5bc);
        auVar5._4_2_ = -(ushort)(sStack_e4 < local_5bc);
        auVar5._6_2_ = -(ushort)(sStack_e2 < local_5bc);
        auVar5._10_2_ = -(ushort)(sStack_de < local_5bc);
        auVar5._8_2_ = -(ushort)(sStack_e0 < local_5bc);
        auVar5._12_2_ = -(ushort)(sStack_dc < local_5bc);
        auVar5._14_2_ = -(ushort)(sStack_da < local_5bc);
        auVar6._8_8_ = uStack_630;
        auVar6._0_8_ = auVar13._0_8_;
        auVar11 = pblendvb(auVar11,auVar6,auVar5);
        local_668 = auVar11._0_8_;
        uStack_660 = auVar11._8_8_;
        *(undefined8 *)*local_488 = local_668;
        *(undefined8 *)(*local_488 + 8) = uStack_660;
        local_5a8 = local_5b8;
        local_5b8 = lddqu(local_5b8,local_480[2]);
        local_488 = local_488 + 1;
        local_480 = local_480 + 1;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_filter_intra_edge_sse4_1(uint16_t *p, int sz, int strength) {
  if (!strength) return;

  DECLARE_ALIGNED(16, static const int16_t, kern[3][8]) = {
    { 4, 8, 4, 8, 4, 8, 4, 8 },  // strength 1: 4,8,4
    { 5, 6, 5, 6, 5, 6, 5, 6 },  // strength 2: 5,6,5
    { 2, 4, 2, 4, 2, 4, 2, 4 }   // strength 3: 2,4,4,4,2
  };

  DECLARE_ALIGNED(16, static const int16_t,
                  v_const[1][8]) = { { 0, 1, 2, 3, 4, 5, 6, 7 } };

  // Extend the first and last samples to simplify the loop for the 5-tap case
  p[-1] = p[0];
  __m128i last = _mm_set1_epi16(p[sz - 1]);
  _mm_storeu_si128((__m128i *)&p[sz], last);

  // Adjust input pointer for filter support area
  uint16_t *in = (strength == 3) ? p - 1 : p;

  // Avoid modifying first sample
  uint16_t *out = p + 1;
  int len = sz - 1;

  const int use_3tap_filter = (strength < 3);

  if (use_3tap_filter) {
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[0]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
    __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
      __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
      __m128i in02 = _mm_add_epi16(in0, in2);
      __m128i d0 = _mm_unpacklo_epi16(in02, in1);
      __m128i d1 = _mm_unpackhi_epi16(in02, in1);
      d0 = _mm_mullo_epi16(d0, coef0);
      d1 = _mm_mullo_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srli_epi16(d0, 4);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi16(n_out);
      __m128i mask = _mm_cmpgt_epi16(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storeu_si128((__m128i *)out, out0);
      in += 8;
      in0 = in8;
      in8 = _mm_lddqu_si128((__m128i *)&in[8]);
      out += 8;
      len -= n_out;
    }
  } else {  // 5-tap filter
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[0]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
    __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
      __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
      __m128i in3 = _mm_alignr_epi8(in8, in0, 6);
      __m128i in4 = _mm_alignr_epi8(in8, in0, 8);
      __m128i in04 = _mm_add_epi16(in0, in4);
      __m128i in123 = _mm_add_epi16(in1, in2);
      in123 = _mm_add_epi16(in123, in3);
      __m128i d0 = _mm_unpacklo_epi16(in04, in123);
      __m128i d1 = _mm_unpackhi_epi16(in04, in123);
      d0 = _mm_mullo_epi16(d0, coef0);
      d1 = _mm_mullo_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srli_epi16(d0, 4);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi16(n_out);
      __m128i mask = _mm_cmpgt_epi16(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storeu_si128((__m128i *)out, out0);
      in += 8;
      in0 = in8;
      in8 = _mm_lddqu_si128((__m128i *)&in[8]);
      out += 8;
      len -= n_out;
    }
  }
}